

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

bool __thiscall
RegVmLoweredFunction::TransferRegisterTo(RegVmLoweredFunction *this,VmValue *value,uchar reg)

{
  uchar uVar1;
  bool bVar2;
  uint uVar3;
  VmInstruction *inst;
  byte *pbVar4;
  unsigned_short *puVar5;
  uchar *puVar6;
  uint local_3c;
  uint local_38;
  uint i_2;
  uint i_1;
  uint i;
  VmInstruction *instruction;
  VmValue *pVStack_20;
  uchar reg_local;
  VmValue *value_local;
  RegVmLoweredFunction *this_local;
  
  instruction._7_1_ = reg;
  pVStack_20 = value;
  value_local = (VmValue *)this;
  inst = getType<VmInstruction>(value);
  if (inst == (VmInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0xe3,"bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)");
  }
  bVar2 = anon_unknown.dwarf_9b1b8::IsNonLocalValue(inst);
  if (!bVar2) {
    for (i_2 = 0; uVar3 = SmallArray<unsigned_char,_16U>::size(&this->constantRegisters),
        i_2 < uVar3; i_2 = i_2 + 1) {
      pbVar4 = SmallArray<unsigned_char,_16U>::operator[](&this->constantRegisters,i_2);
      if (*pbVar4 == instruction._7_1_) {
        puVar5 = FixedArray<unsigned_short,_256U>::operator[]
                           (&this->registerUsers,(uint)instruction._7_1_);
        if (*puVar5 != 1) {
          __assert_fail("registerUsers[reg] == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0xec,
                        "bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)");
        }
        puVar6 = SmallArray<unsigned_char,_16U>::back(&this->constantRegisters);
        uVar1 = *puVar6;
        puVar6 = SmallArray<unsigned_char,_16U>::operator[](&this->constantRegisters,i_2);
        *puVar6 = uVar1;
        SmallArray<unsigned_char,_16U>::pop_back(&this->constantRegisters);
        SmallArray<unsigned_char,_8U>::push_back
                  (&inst->regVmRegisters,(uchar *)((long)&instruction + 7));
        return true;
      }
    }
    for (local_38 = 0; uVar3 = SmallArray<unsigned_char,_16U>::size(&this->delayedFreedRegisters),
        local_38 < uVar3; local_38 = local_38 + 1) {
      pbVar4 = SmallArray<unsigned_char,_16U>::operator[](&this->delayedFreedRegisters,local_38);
      if (*pbVar4 == instruction._7_1_) {
        puVar5 = FixedArray<unsigned_short,_256U>::operator[]
                           (&this->registerUsers,(uint)instruction._7_1_);
        if (*puVar5 != 0) {
          __assert_fail("registerUsers[reg] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0xfb,
                        "bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)");
        }
        puVar6 = SmallArray<unsigned_char,_16U>::back(&this->delayedFreedRegisters);
        uVar1 = *puVar6;
        puVar6 = SmallArray<unsigned_char,_16U>::operator[](&this->delayedFreedRegisters,local_38);
        *puVar6 = uVar1;
        SmallArray<unsigned_char,_16U>::pop_back(&this->delayedFreedRegisters);
        SmallArray<unsigned_char,_8U>::push_back
                  (&inst->regVmRegisters,(uchar *)((long)&instruction + 7));
        puVar5 = FixedArray<unsigned_short,_256U>::operator[]
                           (&this->registerUsers,(uint)instruction._7_1_);
        *puVar5 = *puVar5 + 1;
        return true;
      }
    }
    for (local_3c = 0; uVar3 = SmallArray<unsigned_char,_16U>::size(&this->freedRegisters),
        local_3c < uVar3; local_3c = local_3c + 1) {
      pbVar4 = SmallArray<unsigned_char,_16U>::operator[](&this->freedRegisters,local_3c);
      if (*pbVar4 == instruction._7_1_) {
        puVar5 = FixedArray<unsigned_short,_256U>::operator[]
                           (&this->registerUsers,(uint)instruction._7_1_);
        if (*puVar5 != 0) {
          __assert_fail("registerUsers[reg] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0x10c,
                        "bool RegVmLoweredFunction::TransferRegisterTo(VmValue *, unsigned char)");
        }
        puVar6 = SmallArray<unsigned_char,_16U>::back(&this->freedRegisters);
        uVar1 = *puVar6;
        puVar6 = SmallArray<unsigned_char,_16U>::operator[](&this->freedRegisters,local_3c);
        *puVar6 = uVar1;
        SmallArray<unsigned_char,_16U>::pop_back(&this->freedRegisters);
        SmallArray<unsigned_char,_8U>::push_back
                  (&inst->regVmRegisters,(uchar *)((long)&instruction + 7));
        puVar5 = FixedArray<unsigned_short,_256U>::operator[]
                           (&this->registerUsers,(uint)instruction._7_1_);
        *puVar5 = *puVar5 + 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RegVmLoweredFunction::TransferRegisterTo(VmValue *value, unsigned char reg)
{
	VmInstruction *instruction = getType<VmInstruction>(value);

	assert(instruction);

	if(IsNonLocalValue(instruction))
		return false;

	for(unsigned i = 0; i < constantRegisters.size(); i++)
	{
		if(constantRegisters[i] == reg)
		{
			assert(registerUsers[reg] == 1);

			constantRegisters[i] = constantRegisters.back();
			constantRegisters.pop_back();

			instruction->regVmRegisters.push_back(reg);

			return true;
		}
	}

	for(unsigned i = 0; i < delayedFreedRegisters.size(); i++)
	{
		if(delayedFreedRegisters[i] == reg)
		{
			assert(registerUsers[reg] == 0);

			delayedFreedRegisters[i] = delayedFreedRegisters.back();
			delayedFreedRegisters.pop_back();

			instruction->regVmRegisters.push_back(reg);

			registerUsers[reg]++;

			return true;
		}
	}

	for(unsigned i = 0; i < freedRegisters.size(); i++)
	{
		if(freedRegisters[i] == reg)
		{
			assert(registerUsers[reg] == 0);

			freedRegisters[i] = freedRegisters.back();
			freedRegisters.pop_back();

			instruction->regVmRegisters.push_back(reg);

			registerUsers[reg]++;

			return true;
		}
	}

	return false;
}